

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  long lVar3;
  bool bVar4;
  uchar *puVar5;
  stbi_uc sVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint x;
  uint y;
  uchar *puVar10;
  char *pcVar11;
  byte *pbVar12;
  stbi_uc *psVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  stbi_uc sVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int left_1;
  int *piVar22;
  uchar *puVar23;
  int act_comp;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uint local_d0;
  stbi_uc local_a4 [4];
  uchar *local_a0;
  uint local_98;
  int local_94;
  uchar *local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint *local_60;
  stbi_uc asStack_58 [2];
  byte local_56 [38];
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  iVar18 = 0x5c;
  local_60 = (uint *)px;
  do {
    psVar13 = s->img_buffer;
    if (psVar13 < s->img_buffer_end) {
LAB_00111534:
      s->img_buffer = psVar13 + 1;
    }
    else if (s->read_from_callbacks != 0) {
      iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar9 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar1;
        s->img_buffer_end = psVar2;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar1;
        s->img_buffer_end = psVar1 + iVar9;
      }
      psVar13 = s->img_buffer;
      goto LAB_00111534;
    }
    iVar18 = iVar18 + -1;
  } while (iVar18 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar18 = (*(s->io).eof)(s->io_user_data);
    if (iVar18 == 0) goto LAB_00111582;
    if (s->read_from_callbacks == 0) goto LAB_001115a1;
  }
  if (s->img_buffer_end <= s->img_buffer) {
LAB_001115a1:
    stbi__g_failure_reason = "bad file";
    return (stbi_uc *)0x0;
  }
LAB_00111582:
  if ((uint)(0x10000000 / (ulong)x) < y) {
    stbi__g_failure_reason = "too large";
    return (stbi_uc *)0x0;
  }
  local_a0 = (uchar *)0x0;
  local_94 = req_comp;
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  uVar16 = (ulong)(x * y * 4);
  puVar10 = (uchar *)malloc(uVar16);
  memset(puVar10,0xff,uVar16);
  uVar19 = 0;
  bVar8 = 0;
  piVar22 = py;
  do {
    if (uVar19 == 10) {
      pcVar11 = "bad format";
LAB_0011189d:
      bVar4 = false;
      stbi__g_failure_reason = pcVar11;
    }
    else {
      pbVar12 = s->img_buffer;
      if (pbVar12 < s->img_buffer_end) {
LAB_001116a2:
        s->img_buffer = pbVar12 + 1;
        piVar22 = (int *)(ulong)*pbVar12;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar18 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar18;
          }
          pbVar12 = s->img_buffer;
          goto LAB_001116a2;
        }
        piVar22 = (int *)0x0;
      }
      psVar13 = s->img_buffer;
      if (psVar13 < s->img_buffer_end) {
LAB_0011171f:
        s->img_buffer = psVar13 + 1;
        sVar17 = *psVar13;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar18 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar18;
          }
          psVar13 = s->img_buffer;
          goto LAB_0011171f;
        }
        sVar17 = '\0';
      }
      lVar3 = (long)(int)uVar19 * 3;
      asStack_58[lVar3] = sVar17;
      psVar13 = s->img_buffer;
      if (psVar13 < s->img_buffer_end) {
LAB_001117b8:
        s->img_buffer = psVar13 + 1;
        sVar6 = *psVar13;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar18 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar18;
          }
          psVar13 = s->img_buffer;
          goto LAB_001117b8;
        }
        sVar6 = '\0';
      }
      asStack_58[lVar3 + 1] = sVar6;
      pbVar12 = s->img_buffer;
      if (pbVar12 < s->img_buffer_end) {
LAB_00111840:
        s->img_buffer = pbVar12 + 1;
        bVar7 = *pbVar12;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar18 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar18;
          }
          pbVar12 = s->img_buffer;
          goto LAB_00111840;
        }
        bVar7 = 0;
      }
      uVar19 = uVar19 + 1;
      asStack_58[lVar3 + 2] = bVar7;
      bVar8 = bVar8 | bVar7;
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011187a:
        if (s->img_buffer_end <= s->img_buffer) {
LAB_00111896:
          pcVar11 = "bad file";
          goto LAB_0011189d;
        }
      }
      else {
        iVar18 = (*(s->io).eof)(s->io_user_data);
        if (iVar18 != 0) {
          if (s->read_from_callbacks != 0) goto LAB_0011187a;
          goto LAB_00111896;
        }
      }
      bVar4 = true;
      pcVar11 = "bad format";
      if (sVar17 != '\b') goto LAB_0011189d;
    }
    puVar5 = local_a0;
    if (!bVar4) goto LAB_00111cdd;
  } while ((int)piVar22 != 0);
  *comp = 4 - (uint)((bVar8 & 0x10) == 0);
  puVar5 = puVar10;
  local_98 = uVar19;
  if (y != 0) {
    local_84 = x << 2;
    local_80 = (ulong)y;
    local_78 = (ulong)uVar19;
    local_a0 = (uchar *)0x0;
    uVar16 = 0;
    do {
      if (0 < (int)local_98) {
        local_90 = puVar10 + local_84 * (int)uVar16;
        uVar14 = 0;
        local_70 = uVar16;
        do {
          lVar3 = uVar14 * 3;
          sVar17 = asStack_58[lVar3 + 1];
          local_68 = uVar14;
          if (sVar17 == '\0') {
            bVar8 = asStack_58[lVar3 + 2];
            puVar23 = local_90;
            uVar19 = x;
            do {
              psVar13 = stbi__readval(s,(uint)bVar8,puVar23);
              puVar5 = local_a0;
              if (psVar13 == (stbi_uc *)0x0) goto LAB_00111cdd;
              puVar23 = puVar23 + 4;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          else {
            puVar23 = local_90;
            uVar19 = x;
            if (sVar17 == '\x01') {
              while (0 < (int)uVar19) {
                pbVar12 = s->img_buffer;
                if (pbVar12 < s->img_buffer_end) {
LAB_00111b88:
                  s->img_buffer = pbVar12 + 1;
                  bVar8 = *pbVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar18 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar18;
                    }
                    pbVar12 = s->img_buffer;
                    goto LAB_00111b88;
                  }
                  bVar8 = 0;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00111bb0:
                  if (s->img_buffer < s->img_buffer_end) goto LAB_00111bc0;
LAB_00111c20:
                  stbi__g_failure_reason = "bad file";
LAB_00111c2e:
                  bVar4 = false;
                }
                else {
                  iVar18 = (*(s->io).eof)(s->io_user_data);
                  if (iVar18 != 0) {
                    if (s->read_from_callbacks != 0) goto LAB_00111bb0;
                    goto LAB_00111c20;
                  }
LAB_00111bc0:
                  psVar13 = stbi__readval(s,(uint)asStack_58[lVar3 + 2],local_a4);
                  if (psVar13 == (stbi_uc *)0x0) goto LAB_00111c2e;
                  if ((int)uVar19 < (int)(uint)bVar8) {
                    bVar8 = (byte)uVar19;
                  }
                  if (bVar8 != 0) {
                    uVar15 = 0;
                    do {
                      bVar7 = asStack_58[lVar3 + 2];
                      uVar20 = 0x80;
                      lVar21 = 0;
                      do {
                        if ((uVar20 & bVar7) != 0) {
                          puVar23[lVar21] = local_a4[lVar21];
                        }
                        lVar21 = lVar21 + 1;
                        uVar20 = uVar20 >> 1;
                      } while (lVar21 != 4);
                      uVar15 = uVar15 + 1;
                      puVar23 = puVar23 + 4;
                    } while (uVar15 != bVar8);
                  }
                  uVar19 = uVar19 - bVar8;
                  bVar4 = true;
                }
                puVar5 = local_a0;
                if (!bVar4) goto LAB_00111cdd;
              }
            }
            else {
              local_d0 = x;
              if (sVar17 != '\x02') {
                stbi__g_failure_reason = "bad format";
                local_a0 = (uchar *)0x0;
                puVar5 = local_a0;
                goto LAB_00111cdd;
              }
              while (0 < (int)local_d0) {
                pbVar12 = s->img_buffer;
                if (pbVar12 < s->img_buffer_end) {
LAB_001119f9:
                  s->img_buffer = pbVar12 + 1;
                  bVar8 = *pbVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar18 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar18;
                    }
                    pbVar12 = s->img_buffer;
                    goto LAB_001119f9;
                  }
                  bVar8 = 0;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00111a20:
                  if (s->img_buffer_end <= s->img_buffer) goto LAB_00111a6a;
LAB_00111a30:
                  uVar19 = (uint)bVar8;
                  if ((char)bVar8 < '\0') {
                    if (uVar19 == 0x80) {
                      iVar18 = stbi__get16be(s);
                    }
                    else {
                      iVar18 = uVar19 - 0x7f;
                    }
                    if ((int)local_d0 < iVar18) {
                      stbi__g_failure_reason = "bad file";
LAB_00111b08:
                      bVar4 = false;
                    }
                    else {
                      psVar13 = stbi__readval(s,(uint)asStack_58[lVar3 + 2],local_a4);
                      if (psVar13 == (stbi_uc *)0x0) goto LAB_00111b08;
                      bVar4 = true;
                      if (0 < iVar18) {
                        iVar9 = 0;
                        do {
                          bVar8 = asStack_58[lVar3 + 2];
                          uVar19 = 0x80;
                          lVar21 = 0;
                          do {
                            if ((uVar19 & bVar8) != 0) {
                              puVar23[lVar21] = local_a4[lVar21];
                            }
                            lVar21 = lVar21 + 1;
                            uVar19 = uVar19 >> 1;
                          } while (lVar21 != 4);
                          iVar9 = iVar9 + 1;
                          puVar23 = puVar23 + 4;
                        } while (iVar9 != iVar18);
                      }
                    }
                    if (bVar4) goto LAB_00111b12;
                    goto LAB_00111a78;
                  }
                  if ((int)local_d0 <= (int)uVar19) goto LAB_00111a6a;
                  iVar18 = uVar19 + 1;
                  iVar9 = uVar19 + 1;
                  do {
                    psVar13 = stbi__readval(s,(uint)asStack_58[lVar3 + 2],puVar23);
                    if (psVar13 == (stbi_uc *)0x0) goto LAB_00111a78;
                    puVar23 = puVar23 + 4;
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
LAB_00111b12:
                  local_d0 = local_d0 - iVar18;
                  bVar4 = true;
                }
                else {
                  iVar18 = (*(s->io).eof)(s->io_user_data);
                  if (iVar18 == 0) goto LAB_00111a30;
                  if (s->read_from_callbacks != 0) goto LAB_00111a20;
LAB_00111a6a:
                  stbi__g_failure_reason = "bad file";
LAB_00111a78:
                  bVar4 = false;
                }
                puVar5 = local_a0;
                if (!bVar4) goto LAB_00111cdd;
              }
            }
          }
          uVar14 = local_68 + 1;
          uVar16 = local_70;
        } while (uVar14 != local_78);
      }
      uVar16 = uVar16 + 1;
      puVar5 = puVar10;
    } while (uVar16 != local_80);
  }
LAB_00111cdd:
  local_a0 = puVar5;
  if (local_a0 == (uchar *)0x0) {
    free(puVar10);
    puVar10 = (uchar *)0x0;
  }
  *local_60 = x;
  *py = y;
  iVar18 = local_94;
  if (local_94 == 0) {
    iVar18 = *comp;
  }
  puVar10 = stbi__convert_format(puVar10,4,iVar18,x,y);
  return puVar10;
}

Assistant:

static stbi_uc *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)
{
   stbi_uc *result;
   int i, x,y;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if ((1 << 28) / x < y) return stbi__errpuc("too large", "Image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc(x*y*4);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}